

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

char ** findValue(MAP_HANDLE_DATA *handleData,char *value)

{
  int iVar1;
  ulong local_28;
  size_t i;
  char **result;
  char *value_local;
  MAP_HANDLE_DATA *handleData_local;
  
  if (handleData->values != (char **)0x0) {
    for (local_28 = 0; local_28 < handleData->count; local_28 = local_28 + 1) {
      iVar1 = strcmp(handleData->values[local_28],value);
      if (iVar1 == 0) {
        return handleData->values + local_28;
      }
    }
  }
  return (char **)0x0;
}

Assistant:

static char** findValue(MAP_HANDLE_DATA* handleData, const char* value)
{
    char** result;
    if (handleData->values == NULL)
    {
        result = NULL;
    }
    else
    {
        size_t i;
        result = NULL;
        for (i = 0; i < handleData->count; i++)
        {
            if (strcmp(handleData->values[i], value) == 0)
            {
                result = handleData->values + i;
                break;
            }
        }
    }
    return result;
}